

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

void chaiscript::Boxed_Number::check_type<signed_char,long>(void)

{
  bad_any_cast *this;
  
  this = (bad_any_cast *)__cxa_allocate_exception(8);
  memset(this,0,8);
  detail::exception::bad_any_cast::bad_any_cast(this);
  __cxa_throw(this,&detail::exception::bad_any_cast::typeinfo,
              detail::exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static void check_type() {
#ifdef CHAISCRIPT_MSVC
// MSVC complains about this being redundant / tautologica l
#pragma warning(push)
#pragma warning(disable : 4127 6287)
#endif
      if (sizeof(Source) != sizeof(Target) || std::is_signed<Source>() != std::is_signed<Target>()
          || std::is_floating_point<Source>() != std::is_floating_point<Target>()) {
        throw chaiscript::detail::exception::bad_any_cast();
      }
#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif
    }